

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

int lj_trace_exit(jit_State *J,void *exptr)

{
  int iVar1;
  int *piVar2;
  lua_State *L_00;
  ptrdiff_t pVar3;
  ulong uVar4;
  uint *puVar5;
  ExitState *in_RSI;
  long in_RDI;
  bool bVar6;
  BCIns *retpc;
  ptrdiff_t argbase;
  GCtrace *T;
  void *cf;
  BCIns *pc;
  TValue exiterr;
  int exitcode;
  int errcode;
  ExitDataCP exd;
  ExitState *ex;
  lua_State *L;
  int olderr;
  undefined4 in_stack_fffffffffffffed8;
  MSize in_stack_fffffffffffffedc;
  jit_State *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  lua_State *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  VMEvent ev;
  uint *local_f0;
  TValue local_e8;
  int local_e0;
  int local_dc;
  long local_d8;
  ExitState *local_d0;
  uint *local_c8;
  ExitState *local_c0;
  lua_State *local_b8;
  int local_ac;
  ExitState *local_a8;
  long local_a0;
  int local_98;
  int local_94;
  TValue *local_90;
  int local_84;
  TValue *local_80;
  TValue *local_78;
  TValue *local_70;
  lua_State *local_68;
  TValue *local_60;
  TValue *local_58;
  lua_State *local_50;
  undefined4 local_44;
  lua_State *local_40;
  uint local_34;
  char *local_30;
  TValue *local_28;
  lua_State *local_20;
  char *local_18;
  TValue *local_10;
  lua_State *local_8;
  
  ev = (VMEvent)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_a8 = in_RSI;
  local_a0 = in_RDI;
  piVar2 = __errno_location();
  local_ac = *piVar2;
  local_b8 = *(lua_State **)(local_a0 + 0x68);
  local_c0 = local_a8;
  local_e0 = *(int *)(local_a0 + 0x9b0);
  local_e8.field_2.it = 0xffffffff;
  if (local_e0 != 0) {
    *(undefined4 *)(local_a0 + 0x9b0) = 0;
    local_60 = local_b8->top + -1;
    local_58 = &local_e8;
    local_e8 = *local_60;
    local_30 = "copy of dead GC object";
    local_50 = local_b8;
    local_28 = local_58;
    local_20 = local_b8;
  }
  L_00 = (lua_State *)
         (ulong)*(uint *)(*(long *)(local_a0 + 0x170) + (ulong)*(uint *)(local_a0 + 0x9a8) * 4);
  local_d8 = local_a0;
  local_d0 = local_a8;
  local_dc = lj_vm_cpcall(local_b8,0,&local_d8,trace_exit_cp);
  if (local_dc == 0) {
    if (local_e0 != 0) {
      local_70 = local_b8->top;
      local_b8->top = local_70 + 1;
      local_68 = local_b8;
      local_78 = &local_e8;
      *local_70 = local_e8;
      local_8 = local_b8;
      local_18 = "copy of dead GC object";
      local_10 = local_70;
    }
    if ((((*(byte *)((ulong)(local_b8->glref).ptr32 + 0x109) & 0x80) == 0) &&
        ((*(byte *)((ulong)(local_b8->glref).ptr32 + 0x10b) & 8) != 0)) &&
       (pVar3 = lj_vmevent_prepare(L_00,ev), pVar3 != 0)) {
      local_40 = local_b8;
      local_44 = 0x38;
      if ((long)((ulong)(local_b8->maxstack).ptr32 - (long)local_b8->top) < 0x1c1) {
        lj_state_growstack((lua_State *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      }
      local_80 = local_b8->top;
      local_b8->top = local_80 + 1;
      local_84 = *(int *)(local_a0 + 0x9a8);
      local_80->n = (double)local_84;
      local_90 = local_b8->top;
      local_b8->top = local_90 + 1;
      local_94 = *(int *)(local_a0 + 0x9ac);
      local_90->n = (double)local_94;
      trace_exit_regs(local_b8,local_c0);
      lj_vmevent_call(in_stack_fffffffffffffef0,
                      CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    }
    local_f0 = local_c8;
    uVar4 = (ulong)local_b8->cframe & 0xfffffffffffffffc;
    *(int *)(uVar4 + 0x1c) = (int)local_c8;
    if (local_e0 == 0) {
      if ((*(byte *)((ulong)(local_b8->glref).ptr32 + 0x109) & 0x80) == 0) {
        if ((*(char *)((ulong)(local_b8->glref).ptr32 + 0x59) == '\x02') ||
           (*(char *)((ulong)(local_b8->glref).ptr32 + 0x59) == '\x05')) {
          if ((*(byte *)((ulong)(local_b8->glref).ptr32 + 0x109) & 0x40) == 0) {
            iVar1 = lj_vm_cpcall(local_b8,0,0,trace_exit_gc_cp);
            if (iVar1 != 0) {
              return -iVar1;
            }
            local_dc = 0;
          }
        }
        else if ((*(uint *)(local_a0 + 0x90) & 1) != 0) {
          trace_hotside(in_stack_fffffffffffffee0,
                        (BCIns *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        }
      }
      if ((*local_c8 & 0xff) == 0x57) {
        puVar5 = (uint *)((ulong)*(uint *)(*(long *)(local_a0 + 0x170) +
                                          (ulong)(*local_c8 >> 0x10) * 4) + 0x38);
        local_34 = *puVar5 & 0xff;
        bVar6 = true;
        if (((local_34 != 0x49) && (bVar6 = true, local_34 != 0x4a)) &&
           (bVar6 = true, local_34 != 0x4b)) {
          bVar6 = local_34 == 0x4c;
        }
        if (bVar6) {
          if (*(int *)(local_a0 + 0xd4) == 0x11) {
            *(uint *)(local_a0 + 0x9c0) = *local_c8;
            *(uint **)(local_a0 + 0x9b8) = local_c8;
            **(uint **)(local_a0 + 0x9b8) = *puVar5;
            *(undefined1 *)(local_a0 + 0x9f) = 1;
          }
          else {
            *(int *)(uVar4 + 0x1c) = (int)puVar5;
            local_f0 = puVar5;
          }
        }
      }
      piVar2 = __errno_location();
      *piVar2 = local_ac;
      switch((char)*local_f0) {
      case '?':
        local_98 = ((int)((long)local_b8->top - (long)local_b8->base >> 3) + 1) -
                   (*local_f0 >> 8 & 0xff);
        break;
      default:
        if ((*local_f0 & 0xff) < 0x59) {
          local_98 = 0;
        }
        else {
          local_98 = (int)((long)local_b8->top - (long)local_b8->base >> 3) + 1;
        }
        break;
      case 'A':
      case 'C':
        local_98 = ((int)((long)local_b8->top - (long)local_b8->base >> 3) - (*local_f0 >> 8 & 0xff)
                   ) - (*local_f0 >> 0x10 & 0xff);
        break;
      case 'I':
        local_98 = (((int)((long)local_b8->top - (long)local_b8->base >> 3) + 1) -
                   (*local_f0 >> 8 & 0xff)) - (*local_f0 >> 0x10);
      }
    }
    else {
      local_98 = -local_e0;
    }
  }
  else {
    local_98 = -local_dc;
  }
  return local_98;
}

Assistant:

int LJ_FASTCALL lj_trace_exit(jit_State *J, void *exptr)
{
  ERRNO_SAVE
  lua_State *L = J->L;
  ExitState *ex = (ExitState *)exptr;
  ExitDataCP exd;
  int errcode, exitcode = J->exitcode;
  TValue exiterr;
  const BCIns *pc;
  void *cf;
  GCtrace *T;

  setnilV(&exiterr);
  if (exitcode) {  /* Trace unwound with error code. */
    J->exitcode = 0;
    copyTV(L, &exiterr, L->top-1);
  }

#ifdef EXITSTATE_PCREG
  J->parent = trace_exit_find(J, (MCode *)(intptr_t)ex->gpr[EXITSTATE_PCREG]);
#endif
  T = traceref(J, J->parent); UNUSED(T);
#ifdef EXITSTATE_CHECKEXIT
  if (J->exitno == T->nsnap) {  /* Treat stack check like a parent exit. */
    lj_assertJ(T->root != 0, "stack check in root trace");
    J->exitno = T->ir[REF_BASE].op2;
    J->parent = T->ir[REF_BASE].op1;
    T = traceref(J, J->parent);
  }
#endif
  lj_assertJ(T != NULL && J->exitno < T->nsnap, "bad trace or exit number");
  exd.J = J;
  exd.exptr = exptr;
  errcode = lj_vm_cpcall(L, NULL, &exd, trace_exit_cp);
  if (errcode)
    return -errcode;  /* Return negated error code. */

  if (exitcode) copyTV(L, L->top++, &exiterr);  /* Anchor the error object. */

  if (!(LJ_HASPROFILE && (G(L)->hookmask & HOOK_PROFILE)))
    lj_vmevent_send(L, TEXIT,
      lj_state_checkstack(L, 4+RID_NUM_GPR+RID_NUM_FPR+LUA_MINSTACK);
      setintV(L->top++, J->parent);
      setintV(L->top++, J->exitno);
      trace_exit_regs(L, ex);
    );

  pc = exd.pc;
  cf = cframe_raw(L->cframe);
  setcframe_pc(cf, pc);
  if (exitcode) {
    return -exitcode;
  } else if (LJ_HASPROFILE && (G(L)->hookmask & HOOK_PROFILE)) {
    /* Just exit to interpreter. */
  } else if (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize) {
    if (!(G(L)->hookmask & HOOK_GC)) {
      /* Exited because of GC: drive GC forward. */
      errcode = lj_vm_cpcall(L, NULL, NULL, trace_exit_gc_cp);
      if (errcode)
	return -errcode;  /* Return negated error code. */
    }
  } else if ((J->flags & JIT_F_ON)) {
    trace_hotside(J, pc);
  }
  if (bc_op(*pc) == BC_JLOOP) {
    BCIns *retpc = &traceref(J, bc_d(*pc))->startins;
    if (bc_isret(bc_op(*retpc))) {
      if (J->state == LJ_TRACE_RECORD) {
	J->patchins = *pc;
	J->patchpc = (BCIns *)pc;
	*J->patchpc = *retpc;
	J->bcskip = 1;
      } else {
	pc = retpc;
	setcframe_pc(cf, pc);
      }
    }
  }
  /* Return MULTRES or 0. */
  ERRNO_RESTORE
  switch (bc_op(*pc)) {
  case BC_CALLM: case BC_CALLMT:
    return (int)((BCReg)(L->top - L->base) - bc_a(*pc) - bc_c(*pc) - LJ_FR2);
  case BC_RETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc) - bc_d(*pc));
  case BC_TSETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc));
  default:
    if (bc_op(*pc) >= BC_FUNCF)
      return (int)((BCReg)(L->top - L->base) + 1);
    return 0;
  }
}